

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# updatevector.h
# Opt level: O2

void __thiscall
soplex::
UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setTolerances(UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,shared_ptr<soplex::Tolerances> *tolerances)

{
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,
             &tolerances->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->thedelta)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

void setTolerances(std::shared_ptr<Tolerances>& tolerances)
   {
      thedelta.setTolerances(tolerances);
   }